

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

void Gia_RsbUpdateAdd(Gia_RsbMan_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  word *p_02;
  int local_3c;
  int local_38;
  int k;
  int j;
  int iMint;
  Vec_Int_t *vLevel;
  Vec_Int_t *vLevelN;
  int nLeaves;
  int i;
  int n;
  int iObj_local;
  Gia_RsbMan_t *p_local;
  
  iVar1 = Vec_IntSize(p->vObjs);
  iVar1 = 1 << ((byte)iVar1 & 0x1f);
  iVar2 = Vec_WecSize(p->vSets[0]);
  if (iVar2 != iVar1) {
    __assert_fail("Vec_WecSize(p->vSets[0]) == nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x563,"void Gia_RsbUpdateAdd(Gia_RsbMan_t *, int)");
  }
  iVar2 = Vec_WecSize(p->vSets[1]);
  if (iVar2 != iVar1) {
    __assert_fail("Vec_WecSize(p->vSets[1]) == nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x564,"void Gia_RsbUpdateAdd(Gia_RsbMan_t *, int)");
  }
  for (vLevelN._4_4_ = 0; vLevelN._4_4_ < iVar1; vLevelN._4_4_ = vLevelN._4_4_ + 1) {
    for (nLeaves = 0; nLeaves < 2; nLeaves = nLeaves + 1) {
      p_00 = Vec_WecPushLevel(p->vSets[nLeaves]);
      p_01 = Vec_WecEntry(p->vSets[nLeaves],vLevelN._4_4_);
      local_3c = 0;
      for (local_38 = 0; iVar2 = Vec_IntSize(p_01), local_38 < iVar2; local_38 = local_38 + 1) {
        iVar2 = Vec_IntEntry(p_01,local_38);
        p_02 = Vec_WrdEntryP(p->vSims,p->nWords * iObj);
        iVar3 = Abc_TtGetBit(p_02,iVar2);
        if (iVar3 == 0) {
          Vec_IntWriteEntry(p_01,local_3c,iVar2);
          local_3c = local_3c + 1;
        }
        else {
          Vec_IntPush(p_00,iVar2);
        }
      }
      Vec_IntShrink(p_01,local_3c);
    }
  }
  Vec_IntPush(p->vObjs,iObj);
  iVar2 = Vec_WecSize(p->vSets[0]);
  if (iVar2 != iVar1 * 2) {
    __assert_fail("Vec_WecSize(p->vSets[0]) == 2*nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x577,"void Gia_RsbUpdateAdd(Gia_RsbMan_t *, int)");
  }
  iVar2 = Vec_WecSize(p->vSets[1]);
  if (iVar2 != iVar1 * 2) {
    __assert_fail("Vec_WecSize(p->vSets[1]) == 2*nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x578,"void Gia_RsbUpdateAdd(Gia_RsbMan_t *, int)");
  }
  return;
}

Assistant:

void Gia_RsbUpdateAdd( Gia_RsbMan_t * p, int iObj )
{
    int n, i, nLeaves = 1 << Vec_IntSize(p->vObjs);
    assert( Vec_WecSize(p->vSets[0]) == nLeaves );
    assert( Vec_WecSize(p->vSets[1]) == nLeaves );
    for ( i = 0; i < nLeaves; i++ )
    {
        for ( n = 0; n < 2; n++ )
        {
            Vec_Int_t * vLevelN = Vec_WecPushLevel(p->vSets[n]);  
            Vec_Int_t * vLevel  = Vec_WecEntry(p->vSets[n], i);
            int iMint, j, k = 0;
            Vec_IntForEachEntry( vLevel, iMint, j )
            {
                if ( Abc_TtGetBit(Vec_WrdEntryP(p->vSims, p->nWords*iObj), iMint) )
                    Vec_IntPush( vLevelN, iMint );
                else
                    Vec_IntWriteEntry( vLevel, k++, iMint );
            }
            Vec_IntShrink( vLevel, k );
        }
    }
    Vec_IntPush( p->vObjs, iObj );
    assert( Vec_WecSize(p->vSets[0]) == 2*nLeaves );
    assert( Vec_WecSize(p->vSets[1]) == 2*nLeaves );
}